

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O3

void P(uint64_t *out,uint outstep,uint64_t *in,uint instep)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint64_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  puVar3 = in + 1;
  puVar1 = out + 1;
  lVar8 = 8;
  do {
    puVar1[-1] = puVar3[-1];
    *puVar1 = *puVar3;
    puVar1 = puVar1 + (int)outstep;
    puVar3 = puVar3 + (int)instep;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  uVar2 = (ulong)(outstep * 2);
  uVar4 = (ulong)(outstep * 6);
  uVar5 = *out + out[uVar2] + (out[uVar2] & 0xffffffff) * (*out & 0xffffffff) * 2;
  *out = uVar5;
  uVar5 = uVar5 ^ out[uVar4];
  uVar7 = uVar5 >> 0x20;
  uVar6 = uVar5 << 0x20 | uVar7;
  uVar5 = (ulong)(outstep * 4);
  out[uVar4] = uVar6;
  uVar6 = uVar6 + out[uVar5] + uVar7 * (out[uVar5] & 0xffffffff) * 2;
  out[uVar5] = uVar6;
  uVar6 = uVar6 ^ out[uVar2];
  uVar7 = uVar6 >> 0x18;
  uVar6 = uVar6 << 0x28 | uVar7;
  out[uVar2] = uVar6;
  uVar6 = uVar6 + *out + (uVar7 & 0xffffffff) * (*out & 0xffffffff) * 2;
  *out = uVar6;
  uVar6 = uVar6 ^ out[uVar4];
  uVar7 = uVar6 >> 0x10;
  uVar6 = uVar6 << 0x30 | uVar7;
  out[uVar4] = uVar6;
  uVar7 = uVar6 + out[uVar5] + (uVar7 & 0xffffffff) * (out[uVar5] & 0xffffffff) * 2;
  out[uVar5] = uVar7;
  uVar7 = uVar7 ^ out[uVar2];
  out[uVar2] = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar6 = out[1] + out[uVar2 + 1] + (out[uVar2 + 1] & 0xffffffff) * (out[1] & 0xffffffff) * 2;
  out[1] = uVar6;
  uVar6 = uVar6 ^ out[uVar4 + 1];
  uVar7 = uVar6 >> 0x20;
  uVar6 = uVar6 << 0x20 | uVar7;
  out[uVar4 + 1] = uVar6;
  uVar6 = uVar6 + out[uVar5 + 1] + uVar7 * (out[uVar5 + 1] & 0xffffffff) * 2;
  out[uVar5 + 1] = uVar6;
  uVar6 = uVar6 ^ out[uVar2 + 1];
  uVar7 = uVar6 >> 0x18;
  uVar6 = uVar6 << 0x28 | uVar7;
  out[uVar2 + 1] = uVar6;
  uVar6 = uVar6 + out[1] + (uVar7 & 0xffffffff) * (out[1] & 0xffffffff) * 2;
  out[1] = uVar6;
  uVar6 = uVar6 ^ out[uVar4 + 1];
  uVar7 = uVar6 >> 0x10;
  uVar6 = uVar6 << 0x30 | uVar7;
  out[uVar4 + 1] = uVar6;
  uVar7 = uVar6 + out[uVar5 + 1] + (uVar7 & 0xffffffff) * (out[uVar5 + 1] & 0xffffffff) * 2;
  out[uVar5 + 1] = uVar7;
  uVar7 = uVar7 ^ out[uVar2 + 1];
  out[uVar2 + 1] = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar10 = (ulong)(outstep * 3);
  uVar9 = (ulong)(outstep * 7);
  uVar6 = out[outstep] + out[uVar10] + (out[uVar10] & 0xffffffff) * (out[outstep] & 0xffffffff) * 2;
  out[outstep] = uVar6;
  uVar6 = uVar6 ^ out[uVar9];
  uVar7 = uVar6 >> 0x20;
  uVar11 = uVar6 << 0x20 | uVar7;
  uVar6 = (ulong)(outstep * 5);
  out[uVar9] = uVar11;
  uVar11 = uVar11 + out[uVar6] + uVar7 * (out[uVar6] & 0xffffffff) * 2;
  out[uVar6] = uVar11;
  uVar11 = uVar11 ^ out[uVar10];
  uVar7 = uVar11 >> 0x18;
  uVar11 = uVar11 << 0x28 | uVar7;
  out[uVar10] = uVar11;
  uVar11 = uVar11 + out[outstep] + (uVar7 & 0xffffffff) * (out[outstep] & 0xffffffff) * 2;
  out[outstep] = uVar11;
  uVar11 = uVar11 ^ out[uVar9];
  uVar7 = uVar11 >> 0x10;
  uVar11 = uVar11 << 0x30 | uVar7;
  out[uVar9] = uVar11;
  uVar7 = uVar11 + out[uVar6] + (uVar7 & 0xffffffff) * (out[uVar6] & 0xffffffff) * 2;
  out[uVar6] = uVar7;
  uVar7 = uVar7 ^ out[uVar10];
  out[uVar10] = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar11 = out[(ulong)outstep + 1] + out[uVar10 + 1] +
           (out[uVar10 + 1] & 0xffffffff) * (out[(ulong)outstep + 1] & 0xffffffff) * 2;
  out[(ulong)outstep + 1] = uVar11;
  uVar11 = uVar11 ^ out[uVar9 + 1];
  uVar7 = uVar11 >> 0x20;
  uVar11 = uVar11 << 0x20 | uVar7;
  out[uVar9 + 1] = uVar11;
  uVar11 = uVar11 + out[uVar6 + 1] + uVar7 * (out[uVar6 + 1] & 0xffffffff) * 2;
  out[uVar6 + 1] = uVar11;
  uVar11 = uVar11 ^ out[uVar10 + 1];
  uVar7 = uVar11 >> 0x18;
  uVar11 = uVar11 << 0x28 | uVar7;
  out[uVar10 + 1] = uVar11;
  uVar11 = uVar11 + out[(ulong)outstep + 1] +
           (uVar7 & 0xffffffff) * (out[(ulong)outstep + 1] & 0xffffffff) * 2;
  out[(ulong)outstep + 1] = uVar11;
  uVar11 = uVar11 ^ out[uVar9 + 1];
  uVar7 = uVar11 >> 0x10;
  uVar11 = uVar11 << 0x30 | uVar7;
  out[uVar9 + 1] = uVar11;
  uVar7 = uVar11 + out[uVar6 + 1] + (uVar7 & 0xffffffff) * (out[uVar6 + 1] & 0xffffffff) * 2;
  out[uVar6 + 1] = uVar7;
  uVar7 = uVar7 ^ out[uVar10 + 1];
  out[uVar10 + 1] = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar11 = *out + out[uVar2 + 1] + (out[uVar2 + 1] & 0xffffffff) * (*out & 0xffffffff) * 2;
  *out = uVar11;
  uVar11 = uVar11 ^ out[uVar9 + 1];
  uVar7 = uVar11 >> 0x20;
  uVar11 = uVar11 << 0x20 | uVar7;
  out[uVar9 + 1] = uVar11;
  uVar11 = uVar11 + out[uVar6] + uVar7 * (out[uVar6] & 0xffffffff) * 2;
  out[uVar6] = uVar11;
  uVar11 = uVar11 ^ out[uVar2 + 1];
  uVar7 = uVar11 >> 0x18;
  uVar11 = uVar11 << 0x28 | uVar7;
  out[uVar2 + 1] = uVar11;
  uVar11 = uVar11 + *out + (uVar7 & 0xffffffff) * (*out & 0xffffffff) * 2;
  *out = uVar11;
  uVar11 = uVar11 ^ out[uVar9 + 1];
  uVar7 = uVar11 >> 0x10;
  uVar11 = uVar11 << 0x30 | uVar7;
  out[uVar9 + 1] = uVar11;
  uVar7 = uVar11 + out[uVar6] + (uVar7 & 0xffffffff) * (out[uVar6] & 0xffffffff) * 2;
  out[uVar6] = uVar7;
  uVar7 = uVar7 ^ out[uVar2 + 1];
  out[uVar2 + 1] = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar11 = out[1] + out[uVar10] + (out[uVar10] & 0xffffffff) * (out[1] & 0xffffffff) * 2;
  out[1] = uVar11;
  uVar11 = uVar11 ^ out[uVar4];
  uVar7 = uVar11 >> 0x20;
  uVar11 = uVar11 << 0x20 | uVar7;
  out[uVar4] = uVar11;
  uVar11 = uVar11 + out[uVar6 + 1] + uVar7 * (out[uVar6 + 1] & 0xffffffff) * 2;
  out[uVar6 + 1] = uVar11;
  uVar11 = uVar11 ^ out[uVar10];
  uVar7 = uVar11 >> 0x18;
  uVar11 = uVar11 << 0x28 | uVar7;
  out[uVar10] = uVar11;
  uVar11 = uVar11 + out[1] + (uVar7 & 0xffffffff) * (out[1] & 0xffffffff) * 2;
  out[1] = uVar11;
  uVar11 = uVar11 ^ out[uVar4];
  uVar7 = uVar11 >> 0x10;
  uVar11 = uVar11 << 0x30 | uVar7;
  out[uVar4] = uVar11;
  uVar7 = uVar11 + out[uVar6 + 1] + (uVar7 & 0xffffffff) * (out[uVar6 + 1] & 0xffffffff) * 2;
  out[uVar6 + 1] = uVar7;
  uVar7 = uVar7 ^ out[uVar10];
  out[uVar10] = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar6 = out[outstep] + out[uVar10 + 1] +
          (out[uVar10 + 1] & 0xffffffff) * (out[outstep] & 0xffffffff) * 2;
  out[outstep] = uVar6;
  uVar6 = uVar6 ^ out[uVar4 + 1];
  uVar7 = uVar6 >> 0x20;
  uVar6 = uVar6 << 0x20 | uVar7;
  out[uVar4 + 1] = uVar6;
  uVar6 = uVar6 + out[uVar5] + uVar7 * (out[uVar5] & 0xffffffff) * 2;
  out[uVar5] = uVar6;
  uVar6 = uVar6 ^ out[uVar10 + 1];
  uVar7 = uVar6 >> 0x18;
  uVar6 = uVar6 << 0x28 | uVar7;
  out[uVar10 + 1] = uVar6;
  uVar6 = uVar6 + out[outstep] + (uVar7 & 0xffffffff) * (out[outstep] & 0xffffffff) * 2;
  out[outstep] = uVar6;
  uVar6 = uVar6 ^ out[uVar4 + 1];
  uVar7 = uVar6 >> 0x10;
  uVar6 = uVar6 << 0x30 | uVar7;
  out[uVar4 + 1] = uVar6;
  uVar7 = uVar6 + out[uVar5] + (uVar7 & 0xffffffff) * (out[uVar5] & 0xffffffff) * 2;
  out[uVar5] = uVar7;
  uVar7 = uVar7 ^ out[uVar10 + 1];
  out[uVar10 + 1] = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  uVar4 = out[(ulong)outstep + 1] + out[uVar2] +
          (out[uVar2] & 0xffffffff) * (out[(ulong)outstep + 1] & 0xffffffff) * 2;
  out[(ulong)outstep + 1] = uVar4;
  uVar4 = uVar4 ^ out[uVar9];
  uVar7 = uVar4 >> 0x20;
  uVar4 = uVar4 << 0x20 | uVar7;
  out[uVar9] = uVar4;
  uVar4 = uVar4 + out[uVar5 + 1] + uVar7 * (out[uVar5 + 1] & 0xffffffff) * 2;
  out[uVar5 + 1] = uVar4;
  uVar4 = uVar4 ^ out[uVar2];
  uVar7 = uVar4 >> 0x18;
  uVar4 = uVar4 << 0x28 | uVar7;
  out[uVar2] = uVar4;
  uVar4 = uVar4 + out[(ulong)outstep + 1] +
          (uVar7 & 0xffffffff) * (out[(ulong)outstep + 1] & 0xffffffff) * 2;
  out[(ulong)outstep + 1] = uVar4;
  uVar4 = uVar4 ^ out[uVar9];
  uVar7 = uVar4 >> 0x10;
  uVar4 = uVar4 << 0x30 | uVar7;
  out[uVar9] = uVar4;
  uVar7 = uVar4 + out[uVar5 + 1] + (uVar7 & 0xffffffff) * (out[uVar5 + 1] & 0xffffffff) * 2;
  out[uVar5 + 1] = uVar7;
  uVar7 = uVar7 ^ out[uVar2];
  out[uVar2] = uVar7 << 1 | (ulong)((long)uVar7 < 0);
  return;
}

Assistant:

static inline void P(uint64_t *out, unsigned outstep,
                     uint64_t *in, unsigned instep)
{
    for (unsigned i = 0; i < 8; i++) {
        out[i*outstep] = in[i*instep];
        out[i*outstep+1] = in[i*instep+1];
    }

    GB(out+0*outstep+0, out+2*outstep+0, out+4*outstep+0, out+6*outstep+0);
    GB(out+0*outstep+1, out+2*outstep+1, out+4*outstep+1, out+6*outstep+1);
    GB(out+1*outstep+0, out+3*outstep+0, out+5*outstep+0, out+7*outstep+0);
    GB(out+1*outstep+1, out+3*outstep+1, out+5*outstep+1, out+7*outstep+1);

    GB(out+0*outstep+0, out+2*outstep+1, out+5*outstep+0, out+7*outstep+1);
    GB(out+0*outstep+1, out+3*outstep+0, out+5*outstep+1, out+6*outstep+0);
    GB(out+1*outstep+0, out+3*outstep+1, out+4*outstep+0, out+6*outstep+1);
    GB(out+1*outstep+1, out+2*outstep+0, out+4*outstep+1, out+7*outstep+0);
}